

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::StructUnionMemberSyntax::StructUnionMemberSyntax
          (StructUnionMemberSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token randomQualifier,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  DeclaratorSyntax *pDVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  size_t index;
  
  uVar6 = randomQualifier._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = StructUnionMember;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->attributes).super_SyntaxListBase.childCount = (attributes->super_SyntaxListBase).childCount
  ;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  data_ = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .data_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  size_ = sVar1;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->randomQualifier).kind = (short)uVar6;
  (this->randomQualifier).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->randomQualifier).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->randomQualifier).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->randomQualifier).info = randomQualifier.info;
  (this->type).ptr = type;
  SVar3 = (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
       (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b380;
  sVar1 = (declarators->elements).size_;
  (this->declarators).elements.data_ = (declarators->elements).data_;
  (this->declarators).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  sVar1 = (this->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->attributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar8 = (this->declarators).elements.size_ + 1;
  if (1 < uVar8) {
    index = 0;
    do {
      pDVar5 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::operator[]
                         (&this->declarators,index);
      (pDVar5->super_SyntaxNode).parent = &this->super_SyntaxNode;
      index = index + 1;
    } while (uVar8 >> 1 != index);
  }
  return;
}

Assistant:

StructUnionMemberSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token randomQualifier, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        SyntaxNode(SyntaxKind::StructUnionMember), attributes(attributes), randomQualifier(randomQualifier), type(&type), declarators(declarators), semi(semi) {
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }